

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cc
# Opt level: O0

uint64_t __thiscall wave::File::Tell(File *this)

{
  uint16_t uVar1;
  ulong uVar2;
  pointer this_00;
  uint64_t uVar3;
  uint64_t sample_position;
  File *this_local;
  
  std::unique_ptr<wave::File::Impl,_std::default_delete<wave::File::Impl>_>::operator->
            (&this->impl_);
  uVar2 = std::ofstream::is_open();
  if ((uVar2 & 1) == 0) {
    std::unique_ptr<wave::File::Impl,_std::default_delete<wave::File::Impl>_>::operator->
              (&this->impl_);
    uVar2 = std::ifstream::is_open();
    if ((uVar2 & 1) == 0) {
      return 0;
    }
  }
  this_00 = std::unique_ptr<wave::File::Impl,_std::default_delete<wave::File::Impl>_>::operator->
                      (&this->impl_);
  uVar3 = Impl::current_sample_index(this_00);
  uVar1 = channel_number(this);
  return uVar3 / uVar1;
}

Assistant:

uint64_t File::Tell() const {
  if (!impl_->ostream.is_open() && !impl_->istream.is_open()) {
    return 0;
  }

  auto sample_position = impl_->current_sample_index();
  return sample_position / channel_number();
}